

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-opcodecnt.cc
# Opt level: O1

void WriteCounts(Stream *stream,OpcodeInfoCounts *info_counts)

{
  _Rb_tree_header *p_Var1;
  unsigned_long uVar2;
  Stream *this;
  pair<wabt::Opcode,_unsigned_long> *ppVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  long lVar6;
  pair<wabt::Opcode,_unsigned_long> *pair;
  __normal_iterator<std::pair<wabt::Opcode,_unsigned_long>_*,_std::vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>_>
  _Var7;
  _Rb_tree_header *p_Var8;
  Opcode opcode_1;
  vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>
  sorted;
  Opcode opcode;
  map<wabt::Opcode,_unsigned_long,_std::less<wabt::Opcode>,_std::allocator<std::pair<const_wabt::Opcode,_unsigned_long>_>_>
  counts;
  Opcode local_b4;
  Stream *local_b0;
  __normal_iterator<std::pair<wabt::Opcode,_unsigned_long>_*,_std::vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>_>
  local_a8;
  pair<wabt::Opcode,_unsigned_long> *ppStack_a0;
  undefined8 local_98;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<wabt::Opcode,_unsigned_long>_*,_std::vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>_>,_std::pair<wabt::Opcode,_unsigned_long>_>
  local_90 [2];
  _Rb_tree<wabt::Opcode,_std::pair<const_wabt::Opcode,_unsigned_long>,_std::_Select1st<std::pair<const_wabt::Opcode,_unsigned_long>_>,_std::less<wabt::Opcode>,_std::allocator<std::pair<const_wabt::Opcode,_unsigned_long>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var5 = (info_counts->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(info_counts->_M_t)._M_impl.super__Rb_tree_header;
  local_b0 = stream;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var8) {
    do {
      local_90[0]._M_original_len._0_4_ = p_Var5[1]._M_color;
      lVar6 = *(long *)(p_Var5 + 2);
      pmVar4 = std::
               map<wabt::Opcode,_unsigned_long,_std::less<wabt::Opcode>,_std::allocator<std::pair<const_wabt::Opcode,_unsigned_long>_>_>
               ::operator[]((map<wabt::Opcode,_unsigned_long,_std::less<wabt::Opcode>,_std::allocator<std::pair<const_wabt::Opcode,_unsigned_long>_>_>
                             *)&local_60,(key_type *)local_90);
      *pmVar4 = *pmVar4 + lVar6;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var8);
  }
  local_a8._M_current = (pair<wabt::Opcode,_unsigned_long> *)0x0;
  ppStack_a0 = (pair<wabt::Opcode,_unsigned_long> *)0x0;
  local_98 = 0;
  std::
  copy_if<std::_Rb_tree_iterator<std::pair<wabt::Opcode_const,unsigned_long>>,std::back_insert_iterator<std::vector<std::pair<wabt::Opcode,unsigned_long>,std::allocator<std::pair<wabt::Opcode,unsigned_long>>>>,WithinCutoff<std::pair<wabt::Opcode,unsigned_long>>>
            (local_60._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1,&local_a8);
  ppVar3 = ppStack_a0;
  _Var7._M_current = local_a8._M_current;
  if (local_a8._M_current != ppStack_a0) {
    lVar6 = (long)ppStack_a0 - (long)local_a8._M_current >> 4;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<wabt::Opcode,_unsigned_long>_*,_std::vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>_>,_std::pair<wabt::Opcode,_unsigned_long>_>
    ::_Temporary_buffer(local_90,local_a8,(lVar6 - (lVar6 + 1 >> 0x3f)) + 1 >> 1);
    if (local_90[0]._M_buffer == (pointer)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<wabt::Opcode,unsigned_long>*,std::vector<std::pair<wabt::Opcode,unsigned_long>,std::allocator<std::pair<wabt::Opcode,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<SortByCountDescending<std::pair<wabt::Opcode,unsigned_long>>>>
                (_Var7._M_current,ppVar3);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<wabt::Opcode,unsigned_long>*,std::vector<std::pair<wabt::Opcode,unsigned_long>,std::allocator<std::pair<wabt::Opcode,unsigned_long>>>>,std::pair<wabt::Opcode,unsigned_long>*,long,__gnu_cxx::__ops::_Iter_comp_iter<SortByCountDescending<std::pair<wabt::Opcode,unsigned_long>>>>
                (_Var7._M_current,ppVar3,local_90[0]._M_buffer,local_90[0]._M_len);
    }
    operator_delete(local_90[0]._M_buffer);
  }
  ppVar3 = ppStack_a0;
  this = local_b0;
  if (local_a8._M_current != ppStack_a0) {
    _Var7._M_current = local_a8._M_current;
    do {
      local_b4.enum_ = ((_Var7._M_current)->first).enum_;
      uVar2 = (_Var7._M_current)->second;
      wabt::Opcode::GetInfo(&local_b4);
      wabt::Stream::Writef
                (this,"%s%s%zd\n",
                 CONCAT44(local_90[0]._M_original_len._4_4_,
                          (_Rb_tree_color)local_90[0]._M_original_len),s_separator,uVar2);
      _Var7._M_current = _Var7._M_current + 1;
    } while (_Var7._M_current != ppVar3);
  }
  if (local_a8._M_current != (pair<wabt::Opcode,_unsigned_long> *)0x0) {
    operator_delete(local_a8._M_current);
  }
  std::
  _Rb_tree<wabt::Opcode,_std::pair<const_wabt::Opcode,_unsigned_long>,_std::_Select1st<std::pair<const_wabt::Opcode,_unsigned_long>_>,_std::less<wabt::Opcode>,_std::allocator<std::pair<const_wabt::Opcode,_unsigned_long>_>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  return;
}

Assistant:

void WriteCounts(Stream& stream, const OpcodeInfoCounts& info_counts) {
  typedef std::pair<Opcode, size_t> OpcodeCountPair;

  std::map<Opcode, size_t> counts;
  for (auto& info_count_pair: info_counts) {
    Opcode opcode = info_count_pair.first.opcode();
    size_t count = info_count_pair.second;
    counts[opcode] += count;
  }

  std::vector<OpcodeCountPair> sorted;
  std::copy_if(counts.begin(), counts.end(), std::back_inserter(sorted),
               WithinCutoff<OpcodeCountPair>());

  // Use a stable sort to keep the elements with the same count in opcode
  // order (since the Opcode map is sorted).
  std::stable_sort(sorted.begin(), sorted.end(),
                   SortByCountDescending<OpcodeCountPair>());

  for (auto& pair : sorted) {
    Opcode opcode = pair.first;
    size_t count = pair.second;
    stream.Writef("%s%s%" PRIzd "\n", opcode.GetName(), s_separator, count);
  }
}